

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionMeasurementModel.hpp
# Opt level: O2

void __thiscall
KalmanExamples::Robot1::PositionMeasurementModel<float,_Kalman::StandardBase>::
PositionMeasurementModel
          (PositionMeasurementModel<float,_Kalman::StandardBase> *this,float landmark1x,
          float landmark1y,float landmark2x,float landmark2y)

{
  CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> local_58;
  float local_38;
  float local_34;
  float landmark1y_local;
  float landmark2y_local;
  
  local_38 = landmark1y;
  local_34 = landmark2y;
  landmark1y_local = landmark1x;
  landmark2y_local = landmark2x;
  Kalman::
  LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ::LinearizedMeasurementModel
            (&this->
              super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            );
  (this->
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ).
  super_MeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ._vptr_MeasurementModel = (_func_int **)&PTR_h_00165be8;
  local_58.m_xpr = &(this->landmark1).super_Matrix<float,_2,_1>;
  local_58.m_row = 0;
  local_58.m_col = 1;
  local_58.m_currentBlockRows = 1;
  (this->landmark1).super_Matrix<float,_2,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       landmark1y_local;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator_(&local_58,&local_38);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::finished(&local_58);
  local_58.m_row = 0;
  local_58.m_col = 1;
  local_58.m_currentBlockRows = 1;
  (this->landmark2).super_Matrix<float,_2,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       landmark2y_local;
  local_58.m_xpr = &(this->landmark2).super_Matrix<float,_2,_1>;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator_(&local_58,&local_34);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::finished(&local_58);
  Eigen::internal::setIdentity_impl<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_false>::run
            (&(this->
              super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
              ).V);
  return;
}

Assistant:

PositionMeasurementModel(T landmark1x, T landmark1y, T landmark2x, T landmark2y)
    {
        // Save landmark positions
        landmark1 << landmark1x, landmark1y;
        landmark2 << landmark2x, landmark2y;
        
        // Setup noise jacobian. As this one is static, we can define it once
        // and do not need to update it dynamically
        this->V.setIdentity();
    }